

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O0

void InitIsDefinitiveDraw(void)

{
  int iVar1;
  reference pvVar2;
  int v_1;
  int u_1;
  int v;
  int u;
  TBoard board;
  int i;
  size_type in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_58;
  undefined1 local_54 [4];
  TBoard *in_stack_ffffffffffffffb0;
  int local_30;
  int local_2c;
  TBoard local_28;
  int local_4;
  
  for (local_4 = 0; local_4 < 0x40000; local_4 = local_4 + 1) {
    g_is_definitive_draw[local_4] = false;
    makeBoard4(&local_28,local_4);
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98);
        if (*pvVar2 == 0) {
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff98);
          *pvVar2 = 1;
        }
      }
    }
    iVar1 = TBoardToInt4(in_stack_ffffffffffffffb0);
    if (g_macro_board_status[iVar1] == '\x03') {
      makeBoard4((TBoard *)local_54,local_4);
      memcpy(&local_28,local_54,0x24);
      for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
        for (in_stack_ffffffffffffffa4 = 0; in_stack_ffffffffffffffa4 < 3;
            in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff98);
          if (*pvVar2 == 0) {
            std::array<std::array<int,_3UL>,_3UL>::operator[]
                      ((array<std::array<int,_3UL>,_3UL> *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
            pvVar2 = std::array<int,_3UL>::operator[]
                               ((array<int,_3UL> *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                in_stack_ffffffffffffff98);
            *pvVar2 = 1;
          }
        }
      }
      iVar1 = TBoardToInt4(in_stack_ffffffffffffffb0);
      if (g_macro_board_status[iVar1] == '\x03') {
        g_is_definitive_draw[local_4] = true;
      }
    }
  }
  return;
}

Assistant:

static void
InitIsDefinitiveDraw()
{
    for (int i = 0; i < 262144; ++i)
    {
        g_is_definitive_draw[i] = false;
        auto board = makeBoard4(i);
        for (int u = 0; u < 3; ++u)
            for (int v = 0; v < 3; ++v)
                if (board[u][v] == 0)
                    board[u][v] = 1;
        if (g_macro_board_status[TBoardToInt4(board)] != 3)
            continue;
        board = makeBoard4(i);
        for (int u = 0; u < 3; ++u)
            for (int v = 0; v < 3; ++v)
                if (board[u][v] == 0)
                    board[u][v] = 1;
        if (g_macro_board_status[TBoardToInt4(board)] != 3)
            continue;
        g_is_definitive_draw[i] = true;
    }
}